

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_walldraw.cpp
# Opt level: O3

void swrenderer::R_DrawDrawSeg
               (drawseg_t *ds,int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,
               double yrepeat)

{
  double dVar1;
  double dVar2;
  seg_t *psVar3;
  sector_t_conflict *psVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double bot;
  double dVar12;
  double dVar13;
  
  if (1 << (*(byte *)(rw_pic + 0xd) & 0x1f) == (uint)*(ushort *)(rw_pic + 0x3a)) {
    ProcessWall(x1,x2,uwal,dwal,swal,lwal,yrepeat,true);
  }
  else {
    psVar3 = ds->curline;
    psVar4 = psVar3->frontsector;
    dVar1 = (psVar4->ceilingplane).D;
    dVar5 = (psVar4->ceilingplane).normal.X;
    dVar6 = (psVar4->ceilingplane).normal.Y;
    dVar7 = (psVar3->v1->p).X;
    dVar8 = (psVar3->v1->p).Y;
    dVar11 = (psVar4->ceilingplane).negiC;
    dVar13 = (dVar8 * dVar6 + dVar7 * dVar5 + dVar1) * dVar11;
    dVar2 = (psVar4->floorplane).D;
    dVar9 = (psVar4->floorplane).normal.X;
    dVar10 = (psVar4->floorplane).normal.Y;
    dVar12 = (psVar4->floorplane).negiC;
    bot = (dVar8 * dVar10 + dVar7 * dVar9 + dVar2) * dVar12;
    dVar7 = (psVar3->v2->p).X;
    dVar8 = (psVar3->v2->p).Y;
    dVar11 = (dVar6 * dVar8 + dVar1 + dVar5 * dVar7) * dVar11;
    if (dVar11 <= dVar13) {
      dVar11 = dVar13;
    }
    dVar12 = (dVar8 * dVar10 + dVar2 + dVar7 * dVar9) * dVar12;
    if (((_fake3D & 2) != 0) && (sclipTop <= dVar11)) {
      dVar11 = sclipTop;
    }
    if (dVar12 <= bot) {
      bot = dVar12;
    }
    if (((_fake3D & 1) != 0) && (bot <= sclipBottom)) {
      bot = sclipBottom;
    }
    ProcessWallNP2(x1,x2,uwal,dwal,swal,lwal,yrepeat,dVar11,bot,true);
  }
  return;
}

Assistant:

void R_DrawDrawSeg(drawseg_t *ds, int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal, double yrepeat)
{
	if (rw_pic->GetHeight() != 1 << rw_pic->HeightBits)
	{
		double frontcz1 = ds->curline->frontsector->ceilingplane.ZatPoint(ds->curline->v1);
		double frontfz1 = ds->curline->frontsector->floorplane.ZatPoint(ds->curline->v1);
		double frontcz2 = ds->curline->frontsector->ceilingplane.ZatPoint(ds->curline->v2);
		double frontfz2 = ds->curline->frontsector->floorplane.ZatPoint(ds->curline->v2);
		double top = MAX(frontcz1, frontcz2);
		double bot = MIN(frontfz1, frontfz2);
		if (fake3D & FAKE3D_CLIPTOP)
		{
			top = MIN(top, sclipTop);
		}
		if (fake3D & FAKE3D_CLIPBOTTOM)
		{
			bot = MAX(bot, sclipBottom);
		}
		ProcessWallNP2(x1, x2, uwal, dwal, swal, lwal, yrepeat, top, bot, true);
	}
	else
	{
		ProcessWall(x1, x2, uwal, dwal, swal, lwal, yrepeat, true);
	}
}